

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlCatalogIsEmpty(xmlCatalogPtr catal)

{
  int iVar1;
  int res;
  xmlCatalogPtr catal_local;
  
  if (catal == (xmlCatalogPtr)0x0) {
    catal_local._4_4_ = -1;
  }
  else if (catal->type == XML_XML_CATALOG_TYPE) {
    if (catal->xml == (xmlCatalogEntryPtr)0x0) {
      catal_local._4_4_ = 1;
    }
    else if ((catal->xml->type == XML_CATA_CATALOG) || (catal->xml->type == XML_CATA_BROKEN_CATALOG)
            ) {
      if (catal->xml->children == (_xmlCatalogEntry *)0x0) {
        catal_local._4_4_ = 1;
      }
      else {
        catal_local._4_4_ = 0;
      }
    }
    else {
      catal_local._4_4_ = -1;
    }
  }
  else if (catal->sgml == (xmlHashTablePtr)0x0) {
    catal_local._4_4_ = 1;
  }
  else {
    iVar1 = xmlHashSize(catal->sgml);
    if (iVar1 == 0) {
      catal_local._4_4_ = 1;
    }
    else if (iVar1 < 0) {
      catal_local._4_4_ = -1;
    }
    else {
      catal_local._4_4_ = 0;
    }
  }
  return catal_local._4_4_;
}

Assistant:

int
xmlCatalogIsEmpty(xmlCatalogPtr catal) {
    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	if (catal->xml == NULL)
	    return(1);
	if ((catal->xml->type != XML_CATA_CATALOG) &&
	    (catal->xml->type != XML_CATA_BROKEN_CATALOG))
	    return(-1);
	if (catal->xml->children == NULL)
	    return(1);
        return(0);
    } else {
	int res;

	if (catal->sgml == NULL)
	    return(1);
	res = xmlHashSize(catal->sgml);
	if (res == 0)
	    return(1);
	if (res < 0)
	    return(-1);
    }
    return(0);
}